

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDMeshFragment::CopyFrom
          (ON_SubDMeshFragment *this,ON_SubDMeshFragment *src_fragment,uint display_density)

{
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector quad_normal_00;
  uchar uVar11;
  bool bVar12;
  double *pdVar13;
  double *pdVar14;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar15;
  int iVar16;
  uint uVar17;
  ON_SurfaceCurvature *k;
  ON_SurfaceCurvature *pOVar18;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar19;
  long lVar20;
  ON_SurfaceCurvature *pOVar21;
  uint uVar22;
  ulong a_count;
  ulong uVar23;
  ON_SurfaceCurvature *pOVar24;
  ulong uVar25;
  ulong uVar26;
  uint i_1;
  double *pdVar27;
  uint i;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  bool bVar33;
  ON_SubDMeshFragmentGrid grid;
  ON_3dVector quad_normal;
  ON_3dPoint quad_points [4];
  ON_SubDMeshFragmentGrid local_e8;
  ON_3dVector local_b0;
  ON_3dPoint local_98 [4];
  ulong uVar32;
  
  if (this == src_fragment) {
    return true;
  }
  Clear(this);
  this->m_face = src_fragment->m_face;
  this->m_face_vertex_index[0] = src_fragment->m_face_vertex_index[0];
  this->m_face_vertex_index[1] = src_fragment->m_face_vertex_index[1];
  this->m_face_vertex_index[2] = src_fragment->m_face_vertex_index[2];
  this->m_face_vertex_index[3] = src_fragment->m_face_vertex_index[3];
  this->m_face_fragment_count = src_fragment->m_face_fragment_count;
  this->m_face_fragment_index = src_fragment->m_face_fragment_index;
  bVar12 = GetControlNetQuad(src_fragment,false,local_98,&local_b0);
  if (bVar12) {
    quad_normal_00.y = local_b0.y;
    quad_normal_00.x = local_b0.x;
    quad_normal_00.z = local_b0.z;
    SetControlNetQuad(this,false,local_98,quad_normal_00);
  }
  bVar12 = TextureCoordinatesExistForExperts(src_fragment);
  if (bVar12) {
    this->m_ctrlnetT[0][0] = src_fragment->m_ctrlnetT[0][0];
    this->m_ctrlnetT[0][1] = src_fragment->m_ctrlnetT[0][1];
    this->m_ctrlnetT[0][2] = src_fragment->m_ctrlnetT[0][2];
    this->m_ctrlnetT[1][0] = src_fragment->m_ctrlnetT[1][0];
    this->m_ctrlnetT[1][1] = src_fragment->m_ctrlnetT[1][1];
    this->m_ctrlnetT[1][2] = src_fragment->m_ctrlnetT[1][2];
    this->m_ctrlnetT[2][0] = src_fragment->m_ctrlnetT[2][0];
    this->m_ctrlnetT[2][1] = src_fragment->m_ctrlnetT[2][1];
    this->m_ctrlnetT[2][2] = src_fragment->m_ctrlnetT[2][2];
    this->m_ctrlnetT[3][0] = src_fragment->m_ctrlnetT[3][0];
    this->m_ctrlnetT[3][1] = src_fragment->m_ctrlnetT[3][1];
    this->m_ctrlnetT[3][2] = src_fragment->m_ctrlnetT[3][2];
  }
  if ((src_fragment->m_vertex_capacity_etc & 0x4000) != 0) {
    dVar6 = src_fragment->m_ctrlnetK[0].k2;
    this->m_ctrlnetK[0].k1 = src_fragment->m_ctrlnetK[0].k1;
    this->m_ctrlnetK[0].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[1].k2;
    this->m_ctrlnetK[1].k1 = src_fragment->m_ctrlnetK[1].k1;
    this->m_ctrlnetK[1].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[2].k2;
    this->m_ctrlnetK[2].k1 = src_fragment->m_ctrlnetK[2].k1;
    this->m_ctrlnetK[2].k2 = dVar6;
    dVar6 = src_fragment->m_ctrlnetK[3].k2;
    this->m_ctrlnetK[3].k1 = src_fragment->m_ctrlnetK[3].k1;
    this->m_ctrlnetK[3].k2 = dVar6;
  }
  if ((src_fragment->m_vertex_capacity_etc & 0x2000) != 0) {
    this->m_ctrlnetC[0].field_0 = src_fragment->m_ctrlnetC[0].field_0;
    this->m_ctrlnetC[1].field_0 = src_fragment->m_ctrlnetC[1].field_0;
    this->m_ctrlnetC[2].field_0 = src_fragment->m_ctrlnetC[2].field_0;
    this->m_ctrlnetC[3].field_0 = src_fragment->m_ctrlnetC[3].field_0;
  }
  this->m_pack_rect[0][0] = src_fragment->m_pack_rect[0][0];
  this->m_pack_rect[0][1] = src_fragment->m_pack_rect[0][1];
  this->m_pack_rect[1][0] = src_fragment->m_pack_rect[1][0];
  this->m_pack_rect[1][1] = src_fragment->m_pack_rect[1][1];
  this->m_pack_rect[2][0] = src_fragment->m_pack_rect[2][0];
  this->m_pack_rect[2][1] = src_fragment->m_pack_rect[2][1];
  this->m_pack_rect[3][0] = src_fragment->m_pack_rect[3][0];
  this->m_pack_rect[3][1] = src_fragment->m_pack_rect[3][1];
  if (0xfffffff7 < display_density - 7) {
    uVar30 = src_fragment->m_vertex_count_etc & 0x1fff;
    uVar26 = (ulong)uVar30;
    if ((src_fragment->m_vertex_count_etc & 0x1fff) != 0) {
      bVar2 = (src_fragment->m_grid).m_side_segment_count;
      iVar16 = bVar2 + 1;
      uVar17 = iVar16 * iVar16;
      if (bVar2 == 0) {
        uVar17 = 0;
      }
      if (((uVar17 == uVar30) && (src_fragment->m_P != (double *)0x0)) &&
         (2 < src_fragment->m_P_stride)) {
        if (display_density == 0xffffffff) {
          local_e8.m_reserved1 = (src_fragment->m_grid).m_reserved1;
          local_e8.m_reserved2 = (src_fragment->m_grid).m_reserved2;
          local_e8.m_side_segment_count = (src_fragment->m_grid).m_side_segment_count;
          local_e8.m_reserved3 = (src_fragment->m_grid).m_reserved3;
          local_e8.m_F_count = (src_fragment->m_grid).m_F_count;
          local_e8.m_F_level_of_detail = (src_fragment->m_grid).m_F_level_of_detail;
          local_e8.m_F_stride = (src_fragment->m_grid).m_F_stride;
          local_e8.m_reserved4 = (src_fragment->m_grid).m_reserved4;
          local_e8.m_reserved5 = (src_fragment->m_grid).m_reserved5;
          local_e8.m_F = (src_fragment->m_grid).m_F;
          local_e8.m_S = (src_fragment->m_grid).m_S;
          local_e8.m_prev_level_of_detail = (src_fragment->m_grid).m_prev_level_of_detail;
          local_e8.m_next_level_of_detail = (src_fragment->m_grid).m_next_level_of_detail;
        }
        else {
          ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(&local_e8,display_density,0);
        }
        uVar11 = local_e8.m_side_segment_count;
        uVar31 = (uint)local_e8.m_side_segment_count;
        uVar17 = (local_e8.m_side_segment_count + 1) * (local_e8.m_side_segment_count + 1);
        if (local_e8.m_side_segment_count == 0) {
          uVar17 = (uint)local_e8.m_side_segment_count;
        }
        if (((uVar17 <= (this->m_vertex_capacity_etc & 0x1fff)) ||
            (bVar12 = ReserveManagedVertexCapacity(this,(ulong)uVar17), bVar12)) &&
           ((uVar22 = this->m_vertex_capacity_etc & 0x1fff, uVar17 <= uVar22 &&
            (uVar17 <= (src_fragment->m_vertex_count_etc & 0x1fff))))) {
          (this->m_grid).m_prev_level_of_detail = local_e8.m_prev_level_of_detail;
          (this->m_grid).m_next_level_of_detail = local_e8.m_next_level_of_detail;
          (this->m_grid).m_F = local_e8.m_F;
          (this->m_grid).m_S = local_e8.m_S;
          (this->m_grid).m_reserved1 = local_e8.m_reserved1;
          (this->m_grid).m_reserved2 = local_e8.m_reserved2;
          (this->m_grid).m_side_segment_count = local_e8.m_side_segment_count;
          (this->m_grid).m_reserved3 = local_e8.m_reserved3;
          (this->m_grid).m_F_count = local_e8.m_F_count;
          (this->m_grid).m_F_level_of_detail = local_e8.m_F_level_of_detail;
          (this->m_grid).m_F_stride = local_e8.m_F_stride;
          (this->m_grid).m_reserved4 = local_e8.m_reserved4;
          (this->m_grid).m_reserved5 = local_e8.m_reserved5;
          pdVar14 = this->m_P;
          uVar25 = this->m_P_stride;
          pdVar13 = src_fragment->m_P;
          sVar3 = src_fragment->m_P_stride;
          a_count = (ulong)uVar17;
          if (uVar17 == uVar30) {
            if (uVar25 < 3) {
              uVar22 = 0;
            }
            if (pdVar14 == (double *)0x0) {
              uVar22 = 0;
            }
            if (uVar17 <= uVar22) {
              if (0 < (long)(sVar3 * uVar26)) {
                pdVar27 = pdVar13 + sVar3 * uVar26;
                pdVar14 = pdVar14 + 2;
                do {
                  pdVar14[-2] = *pdVar13;
                  pdVar14[-1] = pdVar13[1];
                  *pdVar14 = pdVar13[2];
                  pdVar14 = pdVar14 + uVar25;
                  pdVar13 = pdVar13 + sVar3;
                } while (pdVar13 < pdVar27);
              }
              dVar6 = (src_fragment->m_surface_bbox).m_min.x;
              dVar7 = (src_fragment->m_surface_bbox).m_min.y;
              dVar8 = (src_fragment->m_surface_bbox).m_min.z;
              dVar9 = (src_fragment->m_surface_bbox).m_max.x;
              dVar10 = (src_fragment->m_surface_bbox).m_max.z;
              (this->m_surface_bbox).m_max.y = (src_fragment->m_surface_bbox).m_max.y;
              (this->m_surface_bbox).m_max.z = dVar10;
              (this->m_surface_bbox).m_min.z = dVar8;
              (this->m_surface_bbox).m_max.x = dVar9;
              (this->m_surface_bbox).m_min.x = dVar6;
              (this->m_surface_bbox).m_min.y = dVar7;
            }
            pdVar14 = this->m_N;
            uVar25 = this->m_N_stride;
            uVar30 = this->m_vertex_capacity_etc & 0x1fff;
            if (uVar25 < 3) {
              uVar30 = 0;
            }
            if (pdVar14 == (double *)0x0) {
              uVar30 = 0;
            }
            if (uVar17 <= uVar30) {
              pdVar13 = src_fragment->m_N;
              uVar32 = src_fragment->m_N_stride;
              bVar12 = uVar17 == (src_fragment->m_vertex_count_etc & 0x1fff);
              if (uVar32 < 3) {
                bVar12 = uVar31 == 0;
              }
              if (pdVar13 == (double *)0x0) {
                bVar12 = uVar31 == 0;
              }
              if (bVar12) {
                if (0 < (long)(uVar32 * uVar26)) {
                  pdVar27 = pdVar13 + uVar32 * uVar26;
                  pdVar14 = pdVar14 + 2;
                  do {
                    pdVar14[-2] = *pdVar13;
                    pdVar14[-1] = pdVar13[1];
                    *pdVar14 = pdVar13[2];
                    pdVar14 = pdVar14 + uVar25;
                    pdVar13 = pdVar13 + uVar32;
                  } while (pdVar13 < pdVar27);
                }
              }
              else {
                Internal_Set3dPointArrayToNan(pdVar14,a_count,uVar25);
              }
            }
            uVar30 = TextureCoordinateCapacity(this);
            if (uVar17 <= uVar30) {
              uVar30 = TextureCoordinateCount(src_fragment);
              if (uVar17 == uVar30) {
                SetTextureCoordinatesExistForExperts(this,true);
                sVar3 = src_fragment->m_T_stride;
                lVar20 = sVar3 * uVar26;
                if (0 < lVar20) {
                  sVar5 = this->m_T_stride;
                  pdVar13 = src_fragment->m_T;
                  pdVar14 = pdVar13 + lVar20;
                  pdVar27 = this->m_T + 2;
                  do {
                    pdVar27[-2] = *pdVar13;
                    pdVar27[-1] = pdVar13[1];
                    *pdVar27 = pdVar13[2];
                    pdVar27 = pdVar27 + sVar5;
                    pdVar13 = pdVar13 + sVar3;
                  } while (pdVar13 < pdVar14);
                }
              }
              else {
                Internal_Set3dPointArrayToNan(this->m_T,a_count,this->m_T_stride);
              }
            }
            pOVar18 = this->m_K;
            sVar3 = this->m_K_stride;
            uVar30 = this->m_vertex_capacity_etc & 0x1fff;
            if (sVar3 == 0) {
              uVar30 = 0;
            }
            if (pOVar18 == (ON_SurfaceCurvature *)0x0) {
              uVar30 = 0;
            }
            if (uVar17 <= uVar30) {
              bVar33 = uVar11 == 0;
              pOVar21 = src_fragment->m_K;
              sVar5 = src_fragment->m_K_stride;
              bVar12 = uVar17 == (src_fragment->m_vertex_count_etc & 0x1fff);
              if (sVar5 == 0) {
                bVar12 = bVar33;
              }
              if (pOVar21 == (ON_SurfaceCurvature *)0x0) {
                bVar12 = bVar33;
              }
              if ((src_fragment->m_vertex_capacity_etc & 0x4000) == 0) {
                bVar12 = bVar33;
              }
              if (bVar12) {
                this->m_vertex_capacity_etc = this->m_vertex_capacity_etc | 0x4000;
                if (0 < (long)(sVar5 * uVar26)) {
                  pOVar24 = pOVar21 + sVar5 * uVar26;
                  do {
                    dVar6 = pOVar21->k2;
                    pOVar18->k1 = pOVar21->k1;
                    pOVar18->k2 = dVar6;
                    pOVar18 = pOVar18 + sVar3;
                    pOVar21 = pOVar21 + sVar5;
                  } while (pOVar21 < pOVar24);
                }
              }
              else if (0 < (long)(sVar3 * a_count)) {
                pOVar21 = pOVar18 + sVar3 * a_count;
                do {
                  dVar6 = ON_SurfaceCurvature::Nan.k2;
                  pOVar18->k1 = ON_SurfaceCurvature::Nan.k1;
                  pOVar18->k2 = dVar6;
                  pOVar18 = pOVar18 + this->m_K_stride;
                } while (pOVar18 < pOVar21);
              }
            }
            paVar19 = &this->m_C->field_0;
            sVar3 = this->m_C_stride;
            uVar30 = this->m_vertex_capacity_etc & 0x1fff;
            if (sVar3 == 0) {
              uVar30 = 0;
            }
            if (paVar19 == (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) {
              uVar30 = 0;
            }
            if (uVar17 <= uVar30) {
              bVar33 = uVar11 == 0;
              paVar15 = &src_fragment->m_C->field_0;
              sVar5 = src_fragment->m_C_stride;
              bVar12 = uVar17 == (src_fragment->m_vertex_count_etc & 0x1fff);
              if (sVar5 == 0) {
                bVar12 = bVar33;
              }
              if (paVar15 == (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) {
                bVar12 = bVar33;
              }
              if ((src_fragment->m_vertex_capacity_etc & 0x2000) == 0) {
                bVar12 = bVar33;
              }
              if (bVar12) {
                this->m_vertex_capacity_etc = this->m_vertex_capacity_etc | 0x2000;
                if (0 < (long)(uVar26 * sVar5)) {
                  paVar1 = paVar15 + uVar26 * sVar5;
                  do {
                    *paVar19 = *paVar15;
                    paVar19 = paVar19 + sVar3;
                    paVar15 = paVar15 + sVar5;
                  } while (paVar15 < paVar1);
                }
              }
              else if (0 < (long)(sVar3 * a_count)) {
                paVar15 = paVar19 + sVar3 * a_count;
                do {
                  *paVar19 = ON_Color::UnsetColor.field_0;
                  paVar19 = paVar19 + this->m_C_stride;
                } while (paVar19 < paVar15);
              }
            }
          }
          else {
            bVar2 = (src_fragment->m_grid).m_side_segment_count;
            uVar30 = 1;
            do {
              uVar29 = uVar30;
              uVar30 = uVar29 * 2;
            } while (uVar29 * uVar31 < (uint)bVar2);
            uVar30 = bVar2 + 1;
            if (bVar2 == 0) {
              uVar30 = (uint)bVar2;
            }
            uVar31 = -(uint)(bVar2 == 0);
            uVar28 = (bVar2 + 1) * uVar29 | uVar31;
            uVar31 = uVar31 | uVar29;
            uVar32 = (ulong)uVar31;
            uVar26 = (ulong)(uVar28 * uVar30);
            if (uVar25 < 3) {
              uVar22 = 0;
            }
            if (pdVar14 == (double *)0x0) {
              uVar22 = 0;
            }
            if (uVar17 <= uVar22) {
              if (bVar2 != 0) {
                uVar22 = 0;
                do {
                  pdVar27 = (double *)((long)pdVar13 + (ulong)uVar22 * sVar3 * uVar26 * 8 + 0x10);
                  uVar29 = 0;
                  do {
                    *pdVar14 = pdVar27[-2];
                    pdVar14[1] = pdVar27[-1];
                    pdVar14[2] = *pdVar27;
                    uVar29 = uVar29 + uVar31;
                    pdVar14 = pdVar14 + uVar25;
                    pdVar27 = pdVar27 + sVar3 * uVar32;
                  } while (uVar29 < uVar30);
                  uVar22 = uVar22 + uVar28;
                } while (uVar22 < uVar30);
              }
              dVar6 = (src_fragment->m_surface_bbox).m_min.x;
              dVar7 = (src_fragment->m_surface_bbox).m_min.y;
              dVar8 = (src_fragment->m_surface_bbox).m_min.z;
              dVar9 = (src_fragment->m_surface_bbox).m_max.x;
              dVar10 = (src_fragment->m_surface_bbox).m_max.z;
              (this->m_surface_bbox).m_max.y = (src_fragment->m_surface_bbox).m_max.y;
              (this->m_surface_bbox).m_max.z = dVar10;
              (this->m_surface_bbox).m_min.z = dVar8;
              (this->m_surface_bbox).m_max.x = dVar9;
              (this->m_surface_bbox).m_min.x = dVar6;
              (this->m_surface_bbox).m_min.y = dVar7;
            }
            pdVar14 = this->m_N;
            uVar25 = this->m_N_stride;
            uVar22 = this->m_vertex_capacity_etc & 0x1fff;
            if (uVar25 < 3) {
              uVar22 = 0;
            }
            if (pdVar14 == (double *)0x0) {
              uVar22 = 0;
            }
            if (uVar17 <= uVar22) {
              pdVar13 = src_fragment->m_N;
              uVar4 = src_fragment->m_N_stride;
              uVar22 = src_fragment->m_vertex_count_etc & 0x1fff;
              if (uVar4 < 3) {
                uVar22 = 0;
              }
              if (pdVar13 == (double *)0x0) {
                uVar22 = 0;
              }
              if (uVar22 < uVar17) {
                Internal_Set3dPointArrayToNan(pdVar14,a_count,uVar25);
              }
              else if (bVar2 != 0) {
                uVar23 = 0;
                do {
                  pdVar27 = (double *)((long)pdVar13 + uVar23 * uVar4 * uVar26 * 8 + 0x10);
                  uVar22 = 0;
                  do {
                    *pdVar14 = pdVar27[-2];
                    pdVar14[1] = pdVar27[-1];
                    pdVar14[2] = *pdVar27;
                    uVar22 = uVar22 + uVar31;
                    pdVar14 = pdVar14 + uVar25;
                    pdVar27 = pdVar27 + uVar4 * uVar32;
                  } while (uVar22 < uVar30);
                  uVar22 = (int)uVar23 + uVar28;
                  uVar23 = (ulong)uVar22;
                } while (uVar22 < uVar30);
              }
            }
            uVar22 = TextureCoordinateCapacity(this);
            if (uVar17 <= uVar22) {
              uVar22 = TextureCoordinateCount(src_fragment);
              if (uVar22 < uVar17) {
                Internal_Set3dPointArrayToNan(this->m_T,a_count,this->m_T_stride);
              }
              else {
                SetTextureCoordinatesExistForExperts(this,true);
                if (bVar2 != 0) {
                  sVar3 = this->m_T_stride;
                  sVar5 = src_fragment->m_T_stride;
                  pdVar14 = this->m_T;
                  pdVar13 = src_fragment->m_T;
                  uVar25 = 0;
                  do {
                    pdVar27 = (double *)((long)pdVar13 + uVar25 * sVar5 * uVar26 * 8 + 0x10);
                    uVar22 = 0;
                    do {
                      *pdVar14 = pdVar27[-2];
                      pdVar14[1] = pdVar27[-1];
                      pdVar14[2] = *pdVar27;
                      uVar22 = uVar22 + uVar31;
                      pdVar14 = pdVar14 + sVar3;
                      pdVar27 = pdVar27 + sVar5 * uVar32;
                    } while (uVar22 < uVar30);
                    uVar22 = (int)uVar25 + uVar28;
                    uVar25 = (ulong)uVar22;
                  } while (uVar22 < uVar30);
                }
              }
            }
            pOVar18 = this->m_K;
            sVar3 = this->m_K_stride;
            uVar22 = this->m_vertex_capacity_etc & 0x1fff;
            if (sVar3 == 0) {
              uVar22 = 0;
            }
            if (pOVar18 == (ON_SurfaceCurvature *)0x0) {
              uVar22 = 0;
            }
            if (uVar17 <= uVar22) {
              sVar5 = src_fragment->m_K_stride;
              uVar22 = src_fragment->m_vertex_count_etc & 0x1fff;
              if (sVar5 == 0) {
                uVar22 = 0;
              }
              if (src_fragment->m_K == (ON_SurfaceCurvature *)0x0) {
                uVar22 = 0;
              }
              if ((src_fragment->m_vertex_capacity_etc & 0x4000) == 0) {
                uVar22 = 0;
              }
              if (uVar22 < uVar17) {
                if (0 < (long)(sVar3 * a_count)) {
                  pOVar21 = pOVar18 + sVar3 * a_count;
                  do {
                    dVar6 = ON_SurfaceCurvature::Nan.k2;
                    pOVar18->k1 = ON_SurfaceCurvature::Nan.k1;
                    pOVar18->k2 = dVar6;
                    pOVar18 = pOVar18 + this->m_K_stride;
                  } while (pOVar18 < pOVar21);
                }
              }
              else {
                this->m_vertex_capacity_etc = this->m_vertex_capacity_etc | 0x4000;
                if (bVar2 != 0) {
                  uVar25 = 0;
                  do {
                    pdVar14 = (double *)
                              ((long)&src_fragment->m_K->k1 + uVar25 * sVar5 * uVar26 * 0x10);
                    uVar22 = 0;
                    do {
                      dVar6 = pdVar14[1];
                      pOVar18->k1 = *pdVar14;
                      pOVar18->k2 = dVar6;
                      uVar22 = uVar22 + uVar31;
                      pdVar14 = pdVar14 + sVar5 * uVar32 * 2;
                      pOVar18 = pOVar18 + sVar3;
                    } while (uVar22 < uVar30);
                    uVar22 = (int)uVar25 + uVar28;
                    uVar25 = (ulong)uVar22;
                  } while (uVar22 < uVar30);
                }
              }
            }
            paVar19 = &this->m_C->field_0;
            sVar3 = this->m_C_stride;
            uVar22 = this->m_vertex_capacity_etc & 0x1fff;
            if (sVar3 == 0) {
              uVar22 = 0;
            }
            if (paVar19 == (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) {
              uVar22 = 0;
            }
            if (uVar17 <= uVar22) {
              sVar5 = src_fragment->m_C_stride;
              uVar22 = src_fragment->m_vertex_count_etc & 0x1fff;
              if (sVar5 == 0) {
                uVar22 = 0;
              }
              if (src_fragment->m_C == (ON_Color *)0x0) {
                uVar22 = 0;
              }
              if ((src_fragment->m_vertex_capacity_etc & 0x2000) == 0) {
                uVar22 = 0;
              }
              if (uVar22 < uVar17) {
                if (0 < (long)(sVar3 * a_count)) {
                  paVar15 = paVar19 + sVar3 * a_count;
                  do {
                    *paVar19 = ON_Color::UnsetColor.field_0;
                    paVar19 = paVar19 + this->m_C_stride;
                  } while (paVar19 < paVar15);
                }
              }
              else {
                this->m_vertex_capacity_etc = this->m_vertex_capacity_etc | 0x2000;
                if (bVar2 != 0) {
                  uVar17 = 0;
                  do {
                    paVar15 = (anon_union_4_2_6147a14e_for_ON_Color_15 *)
                              ((long)&src_fragment->m_C->field_0 +
                              (ulong)uVar17 * uVar26 * sVar5 * 4);
                    uVar22 = 0;
                    do {
                      *paVar19 = *paVar15;
                      uVar22 = uVar22 + uVar31;
                      paVar15 = paVar15 + sVar5 * uVar32;
                      paVar19 = paVar19 + sVar3;
                    } while (uVar22 < uVar30);
                    uVar17 = uVar17 + uVar28;
                  } while (uVar17 < uVar30);
                }
              }
            }
          }
          SetVertexCount(this,a_count);
          return true;
        }
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDMeshFragment::CopyFrom(
  const ON_SubDMeshFragment& src_fragment,
  unsigned int display_density
  )
{
  if (this == &src_fragment)
  {
    return true;
  }

  this->Clear();

  m_face = src_fragment.m_face;
  m_face_vertex_index[0] = src_fragment.m_face_vertex_index[0];
  m_face_vertex_index[1] = src_fragment.m_face_vertex_index[1];
  m_face_vertex_index[2] = src_fragment.m_face_vertex_index[2];
  m_face_vertex_index[3] = src_fragment.m_face_vertex_index[3];
  m_face_fragment_count = src_fragment.m_face_fragment_count;
  m_face_fragment_index = src_fragment.m_face_fragment_index;


  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  if (src_fragment.GetControlNetQuad(false, quad_points, quad_normal))
    this->SetControlNetQuad(false, quad_points, quad_normal);

  if (src_fragment.TextureCoordinatesExistForExperts())
  {
    m_ctrlnetT[0][0] = src_fragment.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src_fragment.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src_fragment.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src_fragment.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src_fragment.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src_fragment.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src_fragment.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src_fragment.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src_fragment.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src_fragment.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src_fragment.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src_fragment.m_ctrlnetT[3][2];
  }

  if (src_fragment.CurvaturesExistForExperts())
  {
    m_ctrlnetK[0] = src_fragment.m_ctrlnetK[0];
    m_ctrlnetK[1] = src_fragment.m_ctrlnetK[1];
    m_ctrlnetK[2] = src_fragment.m_ctrlnetK[2];
    m_ctrlnetK[3] = src_fragment.m_ctrlnetK[3];
  }

  if (src_fragment.ColorsExistForExperts())
  {
    m_ctrlnetC[0] = src_fragment.m_ctrlnetC[0];
    m_ctrlnetC[1] = src_fragment.m_ctrlnetC[1];
    m_ctrlnetC[2] = src_fragment.m_ctrlnetC[2];
    m_ctrlnetC[3] = src_fragment.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src_fragment.m_pack_rect[0][0];
  m_pack_rect[0][1] = src_fragment.m_pack_rect[0][1];
  m_pack_rect[1][0] = src_fragment.m_pack_rect[1][0];
  m_pack_rect[1][1] = src_fragment.m_pack_rect[1][1];
  m_pack_rect[2][0] = src_fragment.m_pack_rect[2][0];
  m_pack_rect[2][1] = src_fragment.m_pack_rect[2][1];
  m_pack_rect[3][0] = src_fragment.m_pack_rect[3][0];
  m_pack_rect[3][1] = src_fragment.m_pack_rect[3][1];

  if ( display_density > ON_SubDDisplayParameters::MaximumDensity && ON_UNSET_UINT_INDEX != display_density)
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned src_V_count = src_fragment.VertexCount();
  if ( 0 == src_V_count || src_V_count != src_fragment.m_grid.GridPointCount() )
    return ON_SUBD_RETURN_ERROR(false);

  if (src_V_count != src_fragment.PointCount())
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDMeshFragmentGrid grid
    = (ON_UNSET_UINT_INDEX == display_density)
    ? src_fragment.m_grid
    : ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density,0);
  const unsigned V_count = grid.GridPointCount();
  if (VertexCapacity() < V_count)
  {
    if (false == this->ReserveManagedVertexCapacity(V_count))
      return ON_SUBD_RETURN_ERROR(false);
  }
  if (V_count > VertexCapacity() || V_count > src_fragment.VertexCount())
    return ON_SUBD_RETURN_ERROR(false);

  m_grid = grid;

  double* p = m_P;
  size_t p_stride = m_P_stride;
  const double* src_p = src_fragment.m_P;
  size_t src_p_stride = src_fragment.m_P_stride;
  const double* src_p1 = src_p + src_p_stride * src_V_count;
  if (V_count == src_V_count)
  {
    // Most common case where srf_fragment and target have the same density - faster way to copy.

    // copy m_P[]
    if (V_count <= this->PointCapacity())
    {
      while (src_p < src_p1)
      {
        p[0] = src_p[0];
        p[1] = src_p[1];
        p[2] = src_p[2];
        p += p_stride;
        src_p += src_p_stride;
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity() )
    {
      if (V_count == src_fragment.NormalCount())
      {
        // copy m_N[]
        p = m_N;
        p_stride = m_N_stride;
        src_p = src_fragment.m_N;
        src_p_stride = src_fragment.m_N_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      if (V_count == src_fragment.TextureCoordinateCount())
      {
        // copy m_T[]
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        src_p = src_fragment.m_T;
        src_p_stride = src_fragment.m_T_stride;
        src_p1 = src_p + src_p_stride * src_V_count;
        while (src_p < src_p1)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += src_p_stride;
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      if (V_count == src_fragment.CurvatureCount())
      {
        // copy m_K[]
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        ON_SurfaceCurvature* src_k = src_fragment.m_K;
        size_t src_k_stride = src_fragment.m_K_stride;
        ON_SurfaceCurvature* src_k1 = src_k + src_k_stride * src_V_count;
        while (src_k < src_k1)
        {
          *k = *src_k;
          k += k_stride;
          src_k += src_k_stride;
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= ColorCapacity())
    {
      if (V_count == src_fragment.ColorCount())
      {
        // copy m_C[]
        SetColorsExistForExperts(true);
        ON_Color* c = m_C;
        const size_t c_stride = m_C_stride;
        ON_Color* src_c = src_fragment.m_C;
        size_t src_c_stride = src_fragment.m_C_stride;
        ON_Color* src_c1 = src_c + src_c_stride * src_V_count;
        while (src_c < src_c1)
        {
          *c = *src_c;
          c += c_stride;
          src_c += src_c_stride;
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }
  else
  {
    // src_fragment is more dense than target. Copy a subset of the points.
    //
    // This code appears to be rarely used. It is not well tested.
    //
    const unsigned int s0 = grid.SideSegmentCount();
    const unsigned int s1 = src_fragment.m_grid.SideSegmentCount();
    unsigned int x = 1;
    while (x*s0 < s1)
      x *= 2;
    const unsigned int m = src_fragment.m_grid.SidePointCount();
    const unsigned int di = src_fragment.m_grid.PointIndexFromGrid2dex(x, 0);
    const unsigned int dj = src_fragment.m_grid.PointIndexFromGrid2dex(0, x);

    // copy from src_fragment.m_P[] to this->m_P[]
    size_t i_stride = di * src_fragment.m_P_stride;
    size_t j_stride = m * dj * src_fragment.m_P_stride;

    if (V_count <= this->PointCapacity())
    {
      for (unsigned int j = 0; j < m; j += dj)
      {
        src_p = src_fragment.m_P + j * j_stride;
        for (unsigned int i = 0; i < m; i += di)
        {
          p[0] = src_p[0];
          p[1] = src_p[1];
          p[2] = src_p[2];
          p += p_stride;
          src_p += i_stride;
        }
      }
      m_surface_bbox = src_fragment.m_surface_bbox;
    }

    if (V_count <= this->NormalCapacity())
    {
      // copy from src_fragment.m_N[] to this->m_N[]
      if (V_count <= src_fragment.NormalCount())
      {
        p = m_N;
        p_stride = m_N_stride;
        i_stride = di * src_fragment.m_N_stride;
        j_stride = m * dj * src_fragment.m_N_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_N + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_N, V_count, m_N_stride);
      }
    }

    if (V_count <= this->TextureCoordinateCapacity())
    {
      // copy from src_fragment.m_T[] to this->m_T[]
      if (V_count <= src_fragment.TextureCoordinateCount())
      {
        SetTextureCoordinatesExistForExperts(true);
        p = m_T;
        p_stride = m_T_stride;
        i_stride = di * src_fragment.m_T_stride;
        j_stride = m * dj * src_fragment.m_T_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          src_p = src_fragment.m_T + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            p[0] = src_p[0];
            p[1] = src_p[1];
            p[2] = src_p[2];
            p += p_stride;
            src_p += i_stride;
          }
        }
      }
      else
      {
        ON_SubDMeshFragment::Internal_Set3dPointArrayToNan(m_T, V_count, m_T_stride);
      }
    }

    if (V_count <= this->CurvatureCapacity())
    {
      // copy from src_fragment.m_K[] to this->m_K[]
      if (V_count <= src_fragment.CurvatureCount())
      {
        SetCurvaturesExistForExperts(true);
        ON_SurfaceCurvature* k = m_K;
        const size_t k_stride = m_K_stride;
        i_stride = di * src_fragment.m_K_stride;
        j_stride = m * dj * src_fragment.m_K_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_SurfaceCurvature* src_k = src_fragment.m_K + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *k = *src_k;
            k += k_stride;
            src_k += i_stride;
          }
        }
      }
      else
      {
        ON_SurfaceCurvature* k = m_K;
        for (ON_SurfaceCurvature* k1 = k + V_count * m_K_stride; k < k1; k += m_K_stride)
          *k = ON_SurfaceCurvature::Nan;
      }
    }

    if (V_count <= this->ColorCapacity())
    {
      // copy from src_fragment.m_C[] to this->m_C[]
      if (V_count <= src_fragment.ColorCount())
      {
        SetColorsExistForExperts(true);
        ON_Color*c = m_C;
        const size_t c_stride = m_C_stride;
        i_stride = di * src_fragment.m_C_stride;
        j_stride = m * dj * src_fragment.m_C_stride;
        for (unsigned int j = 0; j < m; j += dj)
        {
          const ON_Color* src_c = src_fragment.m_C + j * j_stride;
          for (unsigned int i = 0; i < m; i += di)
          {
            *c = *src_c;
            c += c_stride;
            src_c += i_stride;
          }
        }
      }
      else
      {
        ON_Color* c = m_C;
        for (ON_Color* c1 = c + V_count * m_C_stride; c < c1; c += m_C_stride)
          *c = ON_Color::UnsetColor;
      }
    }
  }

  SetVertexCount(V_count);

  return true;
}